

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasgridWrapper.cpp
# Opt level: O1

bool __thiscall
command_tester::inside<5ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>
          (command_tester *this,array<TypeCommand,_5UL> *command_list1,
          vector<TypeCommand,_std::allocator<TypeCommand>_> *command_list2)

{
  TypeCommand *pTVar1;
  array<TypeCommand,_5UL> *paVar2;
  __normal_iterator<const_TypeCommand_*,_std::vector<TypeCommand,_std::allocator<TypeCommand>_>_>
  _Var3;
  bool bVar4;
  
  paVar2 = (array<TypeCommand,_5UL> *)
           std::
           __find_if<TypeCommand_const*,__gnu_cxx::__ops::_Iter_pred<command_tester::inside<5ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,5ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_1_>>
                     (command_list1,command_list1 + 1,this);
  bVar4 = true;
  if (paVar2 == command_list1 + 1) {
    pTVar1 = (command_list2->super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    _Var3 = std::
            __find_if<__gnu_cxx::__normal_iterator<TypeCommand_const*,std::vector<TypeCommand,std::allocator<TypeCommand>>>,__gnu_cxx::__ops::_Iter_pred<command_tester::inside<5ul,std::vector<TypeCommand,std::allocator<TypeCommand>>>(std::array<TypeCommand,5ul>const&,std::vector<TypeCommand,std::allocator<TypeCommand>>const&)::_lambda(TypeCommand)_2_>>
                      ((command_list2->super__Vector_base<TypeCommand,_std::allocator<TypeCommand>_>
                       )._M_impl.super__Vector_impl_data._M_start,pTVar1,this);
    bVar4 = _Var3._M_current != pTVar1;
  }
  return bVar4;
}

Assistant:

bool inside(std::array<TypeCommand, inum> const &command_list1, vec2_t const &command_list2 = {}){
        return (std::any_of(command_list1.begin(), command_list1.end(), [&](TypeCommand c)->bool{ return (c == command); })
            or std::any_of(command_list2.begin(), command_list2.end(), [&](TypeCommand c)->bool{ return (c == command); }));
    }